

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_readwrite.c
# Opt level: O3

void canvas_dataproperties(_glist *x,t_scalar *sc,_binbuf *b)

{
  t_gobj *ptVar1;
  _gobj *x_00;
  _gobj *p_Var2;
  t_word tVar3;
  t_scalar *ptVar4;
  _gobj *p_Var5;
  t_template *ptVar6;
  _gobj *p_Var7;
  long lVar8;
  int iVar9;
  char *pcVar10;
  int iVar11;
  t_scalar *x_01;
  
  glist_noselect(x);
  ptVar4 = (t_scalar *)x->gl_list;
  if (ptVar4 != (t_scalar *)0x0) {
    iVar11 = -1;
    x_01 = (t_scalar *)0x0;
    iVar9 = -1;
    do {
      iVar11 = iVar11 + 1;
      if (ptVar4 == sc) {
        x_01 = ptVar4;
        iVar9 = iVar11;
      }
      ptVar4 = (t_scalar *)(ptVar4->sc_gobj).g_next;
    } while (ptVar4 != (t_scalar *)0x0);
    if (iVar9 != -1) {
      if (b == (_binbuf *)0x0) {
        pcVar10 = "couldn\'t update properties (none given)";
      }
      else {
        glist_readfrombinbuf(x,b,"properties dialog",0);
        ptVar1 = x->gl_list;
        x_00 = ptVar1->g_next;
        if (x_00 != (_gobj *)0x0) {
          for (; iVar11 != 0; iVar11 = iVar11 + -1) {
            if (x_00->g_next == (_gobj *)0x0) goto LAB_001514af;
            ptVar1 = x_00;
            x_00 = x_00->g_next;
          }
          gobj_vis(x_00,x,0);
          ptVar1->g_next = x_00->g_next;
          if (x_01 == (t_scalar *)0x0) {
            pcVar10 = "data_properties: couldn\'t find old element";
LAB_001514d2:
            bug(pcVar10);
            return;
          }
          if ((((x_00->g_pd == scalar_class) && ((x_01->sc_gobj).g_pd == x_00->g_pd)) &&
              (x_00[1].g_pd == (t_pd)x_01->sc_template)) &&
             (ptVar6 = template_findbyname((t_symbol *)x_00[1].g_pd), ptVar6 != (t_template *)0x0))
          {
            if (0 < ptVar6->t_n) {
              lVar8 = 0;
              do {
                tVar3 = *(t_word *)(&x_00[1].g_next + lVar8);
                *(t_word *)(&x_00[1].g_next + lVar8) = x_01->sc_vec[lVar8];
                x_01->sc_vec[lVar8] = tVar3;
                lVar8 = lVar8 + 1;
              } while (lVar8 < ptVar6->t_n);
            }
            pd_free(&x_00->g_pd);
            iVar9 = glist_isvisible(x);
            if (iVar9 != 0) {
              gobj_vis(&x_01->sc_gobj,x,0);
              gobj_vis(&x_01->sc_gobj,x,1);
              return;
            }
          }
          else {
            glist_delete(x,&x_01->sc_gobj);
            p_Var5 = x->gl_list;
            if (iVar9 < 1) {
              x_00->g_next = p_Var5;
              x->gl_list = x_00;
            }
            else {
              if (p_Var5 == (_gobj *)0x0) {
                pcVar10 = "data_properties: can\'t reinsert";
                goto LAB_001514d2;
              }
              if (iVar9 != 1) {
                iVar9 = iVar9 + -1;
                p_Var7 = (_gobj *)0x0;
                do {
                  p_Var2 = p_Var5->g_next;
                  if (p_Var2 == (_gobj *)0x0) goto LAB_00151502;
                  iVar9 = iVar9 + -1;
                  p_Var5 = p_Var2;
                } while (iVar9 != 0);
              }
              p_Var7 = p_Var5->g_next;
LAB_00151502:
              x_00->g_next = p_Var7;
              p_Var5->g_next = x_00;
            }
          }
          return;
        }
LAB_001514af:
        pcVar10 = "couldn\'t update properties (perhaps a format problem?)";
      }
      goto LAB_0015148e;
    }
  }
  pcVar10 = "data_properties: scalar disappeared";
LAB_0015148e:
  pd_error(x,pcVar10);
  return;
}

Assistant:

void canvas_dataproperties(t_canvas *x, t_scalar *sc, t_binbuf *b)
{
    int ntotal, nnew, scindex;
    t_gobj *y, *y2 = 0, *newone, *oldone = 0;
    t_template *template;
    glist_noselect(x);
    for (y = x->gl_list, ntotal = 0, scindex = -1; y; y = y->g_next)
    {
        if (y == &sc->sc_gobj)
            scindex = ntotal, oldone = y;
        ntotal++;
    }

    if (scindex == -1)
    {
        pd_error(x, "data_properties: scalar disappeared");
        return;
    }
    if (!b) {
        pd_error(x, "couldn't update properties (none given)");
        return;
    }
    glist_readfrombinbuf(x, b, "properties dialog", 0);
    newone = 0;
        /* take the new object off the list */
    if (ntotal)
    {
        for (y = x->gl_list, nnew = 1; (y2 = y->g_next);
            y = y2, nnew++)
                if (nnew == ntotal)
        {
            newone = y2;
            gobj_vis(newone, x, 0);
            y->g_next = y2->g_next;
            break;
        }
    }
    else gobj_vis((newone = x->gl_list), x, 0), x->gl_list = newone->g_next;
    if (!newone)
        pd_error(x, "couldn't update properties (perhaps a format problem?)");
    else if (!oldone)
        bug("data_properties: couldn't find old element");
    else if (newone->g_pd == scalar_class && oldone->g_pd == scalar_class
        && ((t_scalar *)newone)->sc_template ==
            ((t_scalar *)oldone)->sc_template
        && (template = template_findbyname(((t_scalar *)newone)->sc_template)))
    {
            /* swap new one with old one; then delete new one */
        int i;
        for (i = 0; i < template->t_n; i++)
        {
            t_word w = ((t_scalar *)newone)->sc_vec[i];
            ((t_scalar *)newone)->sc_vec[i] = ((t_scalar *)oldone)->sc_vec[i];
            ((t_scalar *)oldone)->sc_vec[i] = w;
        }
        pd_free(&newone->g_pd);
        if (glist_isvisible(x))
        {
            gobj_vis(oldone, x, 0);
            gobj_vis(oldone, x, 1);
        }
    }
    else
    {
            /* delete old one; put new one where the old one was on glist */
        glist_delete(x, oldone);
        if (scindex > 0)
        {
            for (y = x->gl_list, nnew = 1; y;
                y = y->g_next, nnew++)
                    if (nnew == scindex || !y->g_next)
            {
                newone->g_next = y->g_next;
                y->g_next = newone;
                goto didit;
            }
            bug("data_properties: can't reinsert");
        }
        else newone->g_next = x->gl_list, x->gl_list = newone;
    }
didit:
    ;
}